

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::Copy(aiNode **_dest,aiNode *src)

{
  uint *__src;
  aiNode **ppaVar1;
  aiNode *this;
  uint *__dest;
  aiNode **ppaVar2;
  ulong uVar3;
  ulong uVar4;
  
  this = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this);
  *_dest = this;
  memcpy(this,src,0x478);
  if (src->mMetaData != (aiMetadata *)0x0) {
    Copy(&this->mMetaData,src->mMetaData);
  }
  __src = this->mMeshes;
  if (__src != (uint *)0x0) {
    uVar3 = (ulong)this->mNumMeshes << 2;
    __dest = (uint *)operator_new__(uVar3);
    this->mMeshes = __dest;
    memcpy(__dest,__src,uVar3);
  }
  if ((ulong)this->mNumChildren == 0) {
    this->mChildren = (aiNode **)0x0;
  }
  else {
    ppaVar1 = src->mChildren;
    uVar4 = (ulong)this->mNumChildren << 3;
    ppaVar2 = (aiNode **)operator_new__(uVar4);
    this->mChildren = ppaVar2;
    uVar3 = 0;
    do {
      Copy((aiNode **)((long)this->mChildren + uVar3),*(aiNode **)((long)ppaVar1 + uVar3));
      uVar3 = uVar3 + 8;
    } while (uVar4 != uVar3);
  }
  if (this->mNumChildren != 0) {
    uVar3 = 0;
    do {
      this->mChildren[uVar3]->mParent = this;
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->mNumChildren);
  }
  return;
}

Assistant:

void SceneCombiner::Copy     (aiNode** _dest, const aiNode* src)
{
    ai_assert(NULL != _dest && NULL != src);

    aiNode* dest = *_dest = new aiNode();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiNode));

    if (src->mMetaData) {
        Copy(&dest->mMetaData, src->mMetaData);
    }

    // and reallocate all arrays
    GetArrayCopy( dest->mMeshes, dest->mNumMeshes );
    CopyPtrArray( dest->mChildren, src->mChildren,dest->mNumChildren);

	// need to set the mParent fields to the created aiNode.
	for( unsigned int i = 0; i < dest->mNumChildren; i ++ ) {
		dest->mChildren[i]->mParent = dest;
	}
}